

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QMakeEvaluator::Location>::emplace<QMakeEvaluator::Location_const&>
          (QPodArrayOps<QMakeEvaluator::Location> *this,qsizetype i,Location *args)

{
  Location **ppLVar1;
  qsizetype *pqVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  Data *pDVar6;
  ProFile *pPVar7;
  undefined6 uVar8;
  qsizetype qVar9;
  Location *pLVar10;
  GrowthPosition where;
  
  pDVar6 = (this->super_QArrayDataPointer<QMakeEvaluator::Location>).d;
  if ((pDVar6 != (Data *)0x0) &&
     ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QMakeEvaluator::Location>).size == i) &&
       (qVar9 = QArrayDataPointer<QMakeEvaluator::Location>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QMakeEvaluator::Location>), qVar9 != 0)) {
      uVar3 = args->line;
      uVar8 = *(undefined6 *)&args->field_0xa;
      pLVar10 = (this->super_QArrayDataPointer<QMakeEvaluator::Location>).ptr +
                (this->super_QArrayDataPointer<QMakeEvaluator::Location>).size;
      pLVar10->pro = args->pro;
      pLVar10->line = uVar3;
      *(undefined6 *)&pLVar10->field_0xa = uVar8;
    }
    else {
      if ((i != 0) ||
         (qVar9 = QArrayDataPointer<QMakeEvaluator::Location>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<QMakeEvaluator::Location>), qVar9 == 0))
      goto LAB_001f384c;
      pLVar10 = (this->super_QArrayDataPointer<QMakeEvaluator::Location>).ptr;
      uVar3 = args->line;
      uVar8 = *(undefined6 *)&args->field_0xa;
      pLVar10[-1].pro = args->pro;
      pLVar10[-1].line = uVar3;
      *(undefined6 *)&pLVar10[-1].field_0xa = uVar8;
      ppLVar1 = &(this->super_QArrayDataPointer<QMakeEvaluator::Location>).ptr;
      *ppLVar1 = *ppLVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QMakeEvaluator::Location>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_001f384c:
  pPVar7 = args->pro;
  uVar3 = args->line;
  uVar4 = *(undefined2 *)&args->field_0xe;
  uVar5 = *(undefined4 *)&args->field_0xa;
  where = (GrowthPosition)
          (i == 0 && (this->super_QArrayDataPointer<QMakeEvaluator::Location>).size != 0);
  QArrayDataPointer<QMakeEvaluator::Location>::detachAndGrow
            (&this->super_QArrayDataPointer<QMakeEvaluator::Location>,where,1,(Location **)0x0,
             (QArrayDataPointer<QMakeEvaluator::Location> *)0x0);
  pLVar10 = createHole(this,where,i,1);
  pLVar10->pro = pPVar7;
  pLVar10->line = uVar3;
  *(undefined4 *)&pLVar10->field_0xa = uVar5;
  *(undefined2 *)&pLVar10->field_0xe = uVar4;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }